

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

Variable __thiscall LiteScript::Memory::Create(Memory *this,Type *type)

{
  int *piVar1;
  _BasicMemory_1 *this_00;
  long lVar2;
  uint in_EDX;
  Variable VVar3;
  
  this_00 = (_BasicMemory_1 *)(&type->_vptr_Type)[*(short *)&type[0x35].name._M_dataplus._M_p];
  if (this_00 == (_BasicMemory_1 *)0x0) {
    this_00 = (_BasicMemory_1 *)operator_new(0xa18);
    _BasicMemory_1::_BasicMemory_1(this_00,(Memory *)type);
    (&type->_vptr_Type)[*(short *)&type[0x35].name._M_dataplus._M_p] = (_func_int **)this_00;
  }
  VVar3 = _BasicMemory_1::Create((_BasicMemory_1 *)this,(Type *)this_00,in_EDX);
  lVar2 = (long)*(short *)&type[0x35].name._M_dataplus._M_p;
  if (*(int *)((long)(&type->_vptr_Type)[lVar2] + 0xa04) == 0x10000) {
    *(undefined2 *)&type[0x35].name._M_dataplus._M_p =
         *(undefined2 *)((long)&type[0x2a].name.field_2 + lVar2 * 2);
  }
  piVar1 = (int *)((long)&type[0x35].name._M_dataplus._M_p + 4);
  *piVar1 = *piVar1 + 1;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::Memory::Create(Type &type) {
    // Si le premier non plein n'existe pas, on le crée
    if (this->arr[this->first_nfull] == nullptr)
        this->arr[this->first_nfull] = (void *)(new LiteScript::_BasicMemory_1(*this));
    // On crée l'objet
    Variable result = ((LiteScript::_BasicMemory_1 *)(this->arr[this->first_nfull]))->Create(type, ((unsigned int)this->first_nfull) << 16);
    // Si le premier non plein devient plein, on passe au suivant
    if (((LiteScript::_BasicMemory_1 *)(this->arr[this->first_nfull]))->isFull())
        this->first_nfull = this->nfull[this->first_nfull];
    // On incrémente le compteur d'objets
    this->count++;
    // On retourne la variable
    return result;
}